

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

QMap<int,_QVariant> __thiscall GenericModel::itemData(GenericModel *this,QModelIndex *index)

{
  GenericModelPrivate *this_00;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  bool bVar2;
  GenericModelItem *pGVar3;
  const_iterator cVar4;
  QVariant *this_01;
  const_iterator cVar5;
  QModelIndex *in_RDX;
  RolesContainer rawData;
  QMap<int,_QVariant> local_28;
  int local_1c;
  
  bVar2 = QModelIndex::isValid(in_RDX);
  if (bVar2) {
    this_00 = (GenericModelPrivate *)index->m;
    if (this_00->m_mergeDisplayEdit == false) {
      pGVar3 = GenericModelPrivate::itemForIndex(this_00,in_RDX);
      pQVar1 = (pGVar3->data).d.d;
      *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        **)this = pQVar1;
      if (pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
    }
    else {
      pGVar3 = GenericModelPrivate::itemForIndex(this_00,in_RDX);
      local_28.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(pGVar3->data).d.d;
      if (local_28.d.d !=
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        LOCK();
        (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)local_28.d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)local_28.d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      local_1c = 0;
      cVar4 = QMap<int,_QVariant>::find(&local_28,&local_1c);
      cVar5._M_node = (_Base_ptr)((long)local_28.d.d + 0x10);
      if (local_28.d.d ==
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        cVar5._M_node = (_Base_ptr)0x0;
      }
      if (cVar4.i._M_node != (const_iterator)cVar5._M_node) {
        local_1c = 2;
        this_01 = QMap<int,_QVariant>::operator[](&local_28,&local_1c);
        ::QVariant::operator=(this_01,(QVariant *)((long)cVar4.i._M_node + 0x28));
      }
      *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        *)this = local_28.d.d;
      if (local_28.d.d !=
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        LOCK();
        *(int *)local_28.d.d = *(int *)local_28.d.d + 1;
        UNLOCK();
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_28.d);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> GenericModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    Q_ASSERT(index.model() == this);
    Q_D(const GenericModel);
    if (!d->m_mergeDisplayEdit)
        return convertFromContainer<QMap<int, QVariant>>(d->itemForIndex(index)->data);
    RolesContainer rawData = d->itemForIndex(index)->data;
    const auto displayIter = rawData.constFind(Qt::DisplayRole);
    if (displayIter != rawData.constEnd())
        rawData[Qt::EditRole] = displayIter.value();
    return convertFromContainer<QMap<int, QVariant>>(rawData);
}